

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBlockCommand.cxx
# Opt level: O0

bool cmBlockCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *args,cmExecutionStatus *status)

{
  pointer *this;
  initializer_list<(anonymous_namespace)::ScopeType> list;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  *this_00;
  cmArgumentParser<Arguments> *pcVar4;
  reference str;
  cmMakefile *pcVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  static_string_view sVar6;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> _Var7;
  basic_string_view<char,_std::char_traits<char>_> bVar8;
  unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_> local_368;
  enum_set<(anonymous_namespace)::ScopeType,_0> local_360;
  unique_ptr<(anonymous_namespace)::cmBlockFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmBlockFunctionBlocker>_>
  local_358;
  __single_object fb;
  string local_348;
  ScopeType local_322 [2];
  iterator local_320;
  undefined8 local_318;
  char local_309;
  cmAlphaNum local_308;
  cmAlphaNum local_2d8;
  string local_2a8;
  pair<cm::enum_set_iterator<cm::enum_set<(anonymous_namespace)::ScopeType,_0>_>,_bool> local_288;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  basic_string_view<char,_std::char_traits<char>_> local_260;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_250;
  pair<cm::enum_set_iterator<cm::enum_set<(anonymous_namespace)::ScopeType,_0>_>,_bool> local_240;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  basic_string_view<char,_std::char_traits<char>_> local_218;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_208;
  reference local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *scope;
  iterator __end2;
  iterator __begin2;
  NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  ScopeSet scopes;
  cmAlphaNum local_1c8;
  cmAlphaNum local_198;
  string local_168;
  undefined1 local_148 [8];
  Arguments parsedArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unrecognizedArguments;
  cmArgumentParser<Arguments> local_98;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  if ((cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar3 = __cxa_guard_acquire(&cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar3 != 0)) {
    local_98.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super_Base.Bindings.ParsedKeyword._M_invoker = (_Invoker_type)0x0;
    local_98.super_Base.Bindings.Positions.
    super_vector<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    .
    super__Vector_base<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>,_std::allocator<std::pair<unsigned_long,_std::function<void_(ArgumentParser::Instance_&,_unsigned_long,_std::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._8_8_ = 0;
    local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_manager = (_Manager_type)0x0;
    local_98.super_Base.Bindings.KeywordMissingValue._M_invoker = (_Invoker_type)0x0;
    local_98.super_Base.Bindings.ParsedKeyword.super__Function_base._M_functor._M_unused._M_object =
         (void *)0x0;
    local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._8_8_ = 0;
    local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_manager =
         (_Manager_type)0x0;
    local_98.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.super_Base.Bindings.KeywordMissingValue.super__Function_base._M_functor._M_unused.
    _M_object = (void *)0x0;
    local_98.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.super_Base.Bindings.Keywords.
    super_vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    .
    super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&)>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    cmArgumentParser<Arguments>::cmArgumentParser(&local_98);
    sVar6 = cm::operator____s("SCOPE_FOR",9);
    this_00 = (cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
               *)cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                 ::
                 Bind<std::optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                           ((cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
                             *)&local_98,sVar6,0x30);
    sVar6 = cm::operator____s("PROPAGATE",9);
    pcVar4 = cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
             ::
             Bind<ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                       (this_00,sVar6,0x50);
    cmArgumentParser<Arguments>::cmArgumentParser(&cmBlockCommand::parser,pcVar4);
    cmArgumentParser<Arguments>::~cmArgumentParser(&local_98);
    __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&cmBlockCommand::parser,
                 &__dso_handle);
    __cxa_guard_release(&cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  this = &parsedArgs.Propagate.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this);
  cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
  ::Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((Arguments *)local_148,
             (cmArgumentParser<cmBlockCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::Arguments>
              *)&cmBlockCommand::parser,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)status_local,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this,0);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&parsedArgs.Propagate.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  pcVar1 = local_20;
  if (bVar2) {
    pcVar5 = cmExecutionStatus::GetMakefile(local_20);
    bVar2 = ArgumentParser::ParseResult::MaybeReportError((ParseResult *)local_148,pcVar5);
    if (bVar2) {
      cmSystemTools::SetFatalErrorOccurred();
      args_local._7_1_ = 1;
      scopes.Set.super__Base_bitset<1UL>._M_w._0_4_ = 1;
    }
    else {
      cm::enum_set<(anonymous_namespace)::ScopeType,_0>::enum_set
                ((enum_set<(anonymous_namespace)::ScopeType,_0> *)&__range2);
      bVar2 = std::optional::operator_cast_to_bool
                        ((optional *)
                         &parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.
                          super__Rb_tree_header._M_node_count);
      if (bVar2) {
        this_01 = &std::
                   optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                   ::operator*((optional<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                *)&parsedArgs.super_ParseResult.KeywordErrors._M_t._M_impl.
                                   super__Rb_tree_header._M_node_count)->
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ;
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(this_01);
        scope = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(this_01);
        while( true ) {
          bVar2 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      *)&scope);
          if (!bVar2) break;
          local_1f8 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end2);
          _Var7 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1f8);
          local_208 = _Var7;
          bVar8 = (basic_string_view<char,_std::char_traits<char>_>)cm::operator____s("VARIABLES",9)
          ;
          local_228 = bVar8;
          local_218 = bVar8;
          bVar2 = std::operator==(local_208,bVar8);
          if (bVar2) {
            cm::enum_set<(anonymous_namespace)::ScopeType,_0>::insert
                      (&local_240,(enum_set<(anonymous_namespace)::ScopeType,_0> *)&__range2,
                       VARIABLES);
          }
          else {
            _Var7 = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1f8);
            local_250 = _Var7;
            bVar8 = (basic_string_view<char,_std::char_traits<char>_>)
                    cm::operator____s("POLICIES",8);
            local_270 = bVar8;
            local_260 = bVar8;
            bVar2 = std::operator==(local_250,bVar8);
            pcVar1 = local_20;
            if (!bVar2) {
              cmAlphaNum::cmAlphaNum(&local_2d8,"SCOPE_FOR unsupported scope \"");
              cmAlphaNum::cmAlphaNum(&local_308,local_1f8);
              local_309 = '\"';
              cmStrCat<char>(&local_2a8,&local_2d8,&local_308,&local_309);
              cmExecutionStatus::SetError(pcVar1,&local_2a8);
              std::__cxx11::string::~string((string *)&local_2a8);
              cmSystemTools::SetFatalErrorOccurred();
              args_local._7_1_ = 0;
              scopes.Set.super__Base_bitset<1UL>._M_w._0_4_ = 1;
              goto LAB_005f1cdc;
            }
            cm::enum_set<(anonymous_namespace)::ScopeType,_0>::insert
                      (&local_288,(enum_set<(anonymous_namespace)::ScopeType,_0> *)&__range2,
                       POLICIES);
          }
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
      }
      else {
        local_322[0] = VARIABLES;
        local_322[1] = 1;
        local_320 = local_322;
        local_318 = 2;
        list._M_len = 2;
        list._M_array = local_320;
        cm::enum_set<(anonymous_namespace)::ScopeType,_0>::operator=
                  ((enum_set<(anonymous_namespace)::ScopeType,_0> *)&__range2,list);
      }
      bVar2 = cm::enum_set<(anonymous_namespace)::ScopeType,_0>::contains
                        ((enum_set<(anonymous_namespace)::ScopeType,_0> *)&__range2,VARIABLES);
      if (!bVar2) {
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&parsedArgs.ScopeFor.
                            super__Optional_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<ArgumentParser::NonEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_engaged);
        pcVar1 = local_20;
        if (!bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,
                     "PROPAGATE cannot be specified without a new scope for VARIABLES",
                     (allocator<char> *)
                     ((long)&fb._M_t.
                             super___uniq_ptr_impl<(anonymous_namespace)::cmBlockFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmBlockFunctionBlocker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::cmBlockFunctionBlocker_*,_std::default_delete<(anonymous_namespace)::cmBlockFunctionBlocker>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::cmBlockFunctionBlocker_*,_false>
                             ._M_head_impl + 7));
          cmExecutionStatus::SetError(pcVar1,&local_348);
          std::__cxx11::string::~string((string *)&local_348);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&fb._M_t.
                             super___uniq_ptr_impl<(anonymous_namespace)::cmBlockFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmBlockFunctionBlocker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_(anonymous_namespace)::cmBlockFunctionBlocker_*,_std::default_delete<(anonymous_namespace)::cmBlockFunctionBlocker>_>
                             .
                             super__Head_base<0UL,_(anonymous_namespace)::cmBlockFunctionBlocker_*,_false>
                             ._M_head_impl + 7));
          cmSystemTools::SetFatalErrorOccurred();
          args_local._7_1_ = 0;
          scopes.Set.super__Base_bitset<1UL>._M_w._0_4_ = 1;
          goto LAB_005f1cdc;
        }
      }
      local_360.Set.super__Base_bitset<1UL>._M_w =
           (bitset<8UL>)cmExecutionStatus::GetMakefile(local_20);
      std::
      make_unique<(anonymous_namespace)::cmBlockFunctionBlocker,cmMakefile*,cm::enum_set<(anonymous_namespace)::ScopeType,0>&,ArgumentParser::MaybeEmpty<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                ((cmMakefile **)&local_358,&local_360,
                 (MaybeEmpty<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&__range2);
      pcVar5 = cmExecutionStatus::GetMakefile(local_20);
      std::unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>>::
      unique_ptr<(anonymous_namespace)::cmBlockFunctionBlocker,std::default_delete<(anonymous_namespace)::cmBlockFunctionBlocker>,void>
                ((unique_ptr<cmFunctionBlocker,std::default_delete<cmFunctionBlocker>> *)&local_368,
                 &local_358);
      cmMakefile::AddFunctionBlocker(pcVar5,&local_368);
      std::unique_ptr<cmFunctionBlocker,_std::default_delete<cmFunctionBlocker>_>::~unique_ptr
                (&local_368);
      args_local._7_1_ = 1;
      scopes.Set.super__Base_bitset<1UL>._M_w._0_4_ = 1;
      std::
      unique_ptr<(anonymous_namespace)::cmBlockFunctionBlocker,_std::default_delete<(anonymous_namespace)::cmBlockFunctionBlocker>_>
      ::~unique_ptr(&local_358);
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_198,"called with unsupported argument \"");
    str = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&parsedArgs.Propagate.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    cmAlphaNum::cmAlphaNum(&local_1c8,str);
    scopes.Set.super__Base_bitset<1UL>._M_w._7_1_ = 0x22;
    cmStrCat<char>(&local_168,&local_198,&local_1c8,
                   (char *)((long)&scopes.Set.super__Base_bitset<1UL>._M_w + 7));
    cmExecutionStatus::SetError(pcVar1,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    cmSystemTools::SetFatalErrorOccurred();
    args_local._7_1_ = 0;
    scopes.Set.super__Base_bitset<1UL>._M_w._0_4_ = 1;
  }
LAB_005f1cdc:
  cmBlockCommand::Arguments::~Arguments((Arguments *)local_148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&parsedArgs.Propagate.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmBlockCommand(std::vector<std::string> const& args,
                    cmExecutionStatus& status)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::vector<std::string>>> ScopeFor;
    ArgumentParser::MaybeEmpty<std::vector<std::string>> Propagate;
  };
  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("SCOPE_FOR"_s, &Arguments::ScopeFor)
                               .Bind("PROPAGATE"_s, &Arguments::Propagate);
  std::vector<std::string> unrecognizedArguments;
  auto parsedArgs = parser.Parse(args, &unrecognizedArguments);

  if (!unrecognizedArguments.empty()) {
    status.SetError(cmStrCat("called with unsupported argument \"",
                             unrecognizedArguments[0], '"'));
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  if (parsedArgs.MaybeReportError(status.GetMakefile())) {
    cmSystemTools::SetFatalErrorOccurred();
    return true;
  }

  ScopeSet scopes;

  if (parsedArgs.ScopeFor) {
    for (auto const& scope : *parsedArgs.ScopeFor) {
      if (scope == "VARIABLES"_s) {
        scopes.insert(ScopeType::VARIABLES);
        continue;
      }
      if (scope == "POLICIES"_s) {
        scopes.insert(ScopeType::POLICIES);
        continue;
      }
      status.SetError(cmStrCat("SCOPE_FOR unsupported scope \"", scope, '"'));
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
  } else {
    scopes = { ScopeType::VARIABLES, ScopeType::POLICIES };
  }
  if (!scopes.contains(ScopeType::VARIABLES) &&
      !parsedArgs.Propagate.empty()) {
    status.SetError(
      "PROPAGATE cannot be specified without a new scope for VARIABLES");
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // create a function blocker
  auto fb = cm::make_unique<cmBlockFunctionBlocker>(
    &status.GetMakefile(), scopes, parsedArgs.Propagate);
  status.GetMakefile().AddFunctionBlocker(std::move(fb));

  return true;
}